

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  value_type vVar7;
  Type type;
  key_type line;
  FILE *actual_predicate_value;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  hasher *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff9f0;
  Type in_stack_fffffffffffff9fc;
  AssertHelper *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa30;
  undefined2 in_stack_fffffffffffffa34;
  undefined1 in_stack_fffffffffffffa36;
  undefined1 in_stack_fffffffffffffa37;
  undefined4 in_stack_fffffffffffffa40;
  value_type in_stack_fffffffffffffa4c;
  uint i_00;
  key_type *key;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  string local_580 [48];
  key_type local_550;
  undefined1 local_549;
  AssertionResult local_548;
  string local_538 [48];
  key_type local_508;
  undefined1 local_501;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffb08;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb10;
  AssertionResult local_480;
  string local_470 [48];
  key_type local_440;
  undefined1 local_439;
  AssertionResult local_438 [2];
  key_type local_414;
  value_type local_3bc;
  AssertionResult local_3b8 [2];
  key_type local_394;
  value_type local_33c;
  AssertionResult local_338;
  string local_328 [55];
  undefined1 local_2f1;
  AssertionResult local_2f0;
  string local_2e0 [55];
  undefined1 local_2a9;
  AssertionResult local_2a8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_298 [2];
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_270;
  string local_1d8 [55];
  undefined1 local_1a1;
  AssertionResult local_1a0;
  string local_190 [55];
  undefined1 local_159;
  AssertionResult local_158;
  FILE *local_148;
  key_type local_140;
  key_type local_13c;
  value_type local_e0;
  int local_dc;
  key_type local_d8;
  undefined1 local_c8 [200];
  
  bVar1 = google::
          HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    i_00 = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    key = (key_type *)(local_c8 + 0x10);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    this_02 = (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_c8;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
              ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)this_02,i_00,(int *)(ulong)i_00)
    ;
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff9f0,
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffff9e0,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (allocator_type *)in_stack_fffffffffffff9d0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
              ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_c8);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_d8 = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9d0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    for (local_dc = 1; local_dc < 100; local_dc = local_dc + 1) {
      in_stack_fffffffffffffa4c =
           HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
      local_e0 = in_stack_fffffffffffffa4c;
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08._M_head_impl);
    }
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_13c = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff9d0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    kVar6 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_140 = kVar6;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff9d0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    actual_predicate_value = tmpfile();
    local_159 = actual_predicate_value != (FILE *)0x0;
    local_148 = actual_predicate_value;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6b0e3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(in_stack_fffffffffffffa37,
                                  CONCAT16(in_stack_fffffffffffffa36,
                                           CONCAT24(in_stack_fffffffffffffa34,
                                                    in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_190);
      testing::Message::~Message((Message *)0xf6b1a6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6b23a);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                      ((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)(local_c8 + 0x28),local_148);
    local_1a1 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6b27b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa36,
                                                 CONCAT24(in_stack_fffffffffffffa34,
                                                          in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_1d8);
      testing::Message::~Message((Message *)0xf6b350);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6b3e7);
    rewind(local_148);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_298,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff9f0,
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffff9e0,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (allocator_type *)in_stack_fffffffffffff9d0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_298);
    local_2a9 = local_148 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6b48f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa36,
                                                 CONCAT24(in_stack_fffffffffffffa34,
                                                          in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_2e0);
      testing::Message::~Message((Message *)0xf6b5a3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6b637);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                      (&local_270,local_148);
    local_2f1 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6b678);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa34,
                                                                in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_328);
      testing::Message::~Message((Message *)0xf6b74d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6b7e4);
    fclose(local_148);
    vVar7 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_33c = vVar7;
    local_394 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_02,key);
    google::
    sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf6b865);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (char *)in_stack_fffffffffffff9e0,
               (int *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (int *)in_stack_fffffffffffff9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::AssertionResult::failure_message((AssertionResult *)0xf6b8d3);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      testing::Message::~Message((Message *)0xf6b930);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6b9a1);
    local_3bc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_414 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_02,key);
    google::
    sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf6ba13);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (char *)in_stack_fffffffffffff9e0,
               (int *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (int *)in_stack_fffffffffffff9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::AssertionResult::failure_message((AssertionResult *)0xf6ba81);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      testing::Message::~Message((Message *)0xf6bade);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6bb4f);
    local_440 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9d0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_439 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6bbb7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa34,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
                 in_stack_fffffffffffff9ec,(char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_470);
      testing::Message::~Message((Message *)0xf6bc8c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6bd23);
    type = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_02,key);
    google::
    sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf6bd95);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (char *)in_stack_fffffffffffff9e0,
               (int *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (int *)in_stack_fffffffffffff9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffff9f0 =
           (HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf6be03);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      testing::Message::~Message((Message *)0xf6be60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6bed1);
    line = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_508 = line;
    message = (char *)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff9d0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_501 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6bf39);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffb00);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa34,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff9f0,line,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_538);
      testing::Message::~Message((Message *)0xf6c00e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6c0a5);
    local_550 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9d0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_549 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf6c10d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_548);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa40),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa34,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff9f0,line,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffa4c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_580);
      testing::Message::~Message((Message *)0xf6c1e2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6c276);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf6c283);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf6c290);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, NopointerSerialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}